

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O2

FName __thiscall FSkillInfo::GetReplacement(FSkillInfo *this,FName *a)

{
  int iVar1;
  FName *pFVar2;
  int *in_RDX;
  FName local_20;
  FName local_1c;
  
  local_1c.Index = *in_RDX;
  pFVar2 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::CheckKey
                     ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(a + 0x28),
                      &local_1c);
  if (pFVar2 == (FName *)0x0) {
    iVar1 = 0;
  }
  else {
    local_20.Index = *in_RDX;
    pFVar2 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator[]
                       ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(a + 0x28),
                        &local_20);
    iVar1 = pFVar2->Index;
  }
  (this->Name).Index = iVar1;
  return (FName)(int)this;
}

Assistant:

FName FSkillInfo::GetReplacement(FName a)
{
	if (Replace.CheckKey(a)) return Replace[a];
	else return NAME_None;
}